

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score.c
# Opt level: O2

size_t highscore_where(high_score *entry,high_score *scores,size_t sz)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *__s1;
  size_t sVar5;
  
  __s1 = scores->how;
  sVar5 = 0;
  do {
    if (sz == sVar5) {
      return sz - 1;
    }
    uVar3 = strtoul(entry->pts,(char **)0x0,0);
    uVar4 = strtoul(__s1 + -0x56,(char **)0x0,0);
    iVar1 = strcmp(entry->how,"Ripe Old Age");
    iVar2 = strcmp(__s1,"Ripe Old Age");
    if (iVar1 == 0 && iVar2 != 0) {
      return sVar5;
    }
    if (iVar1 == 0 || iVar2 != 0) {
      if ((long)uVar4 <= (long)uVar3) {
        return sVar5;
      }
      if (((high_score *)(__s1 + -0x5e))->what[0] == '\0') {
        return sVar5;
      }
    }
    sVar5 = sVar5 + 1;
    __s1 = __s1 + 0x7e;
  } while( true );
}

Assistant:

size_t highscore_where(const struct high_score *entry,
					   const struct high_score scores[], size_t sz)
{
	size_t i;

	/* Read until we get to a higher score */
	for (i = 0; i < sz; i++) {
		long entry_pts = strtoul(entry->pts, NULL, 0);
		long score_pts = strtoul(scores[i].pts, NULL, 0);
		bool entry_winner = streq(entry->how, "Ripe Old Age");
		bool score_winner = streq(scores[i].how, "Ripe Old Age");

		if (entry_winner && !score_winner)
			return i;

		if (!entry_winner && score_winner)
			continue;

		if (entry_pts >= score_pts)
			return i;

		if (scores[i].what[0] == '\0')
			return i;
	}

	/* The last entry is always usable */
	return sz - 1;
}